

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

void duckdb::QuantileScalarOperation<false,duckdb::QuantileStandardType>::
     Finalize<double,duckdb::QuantileState<int,duckdb::QuantileStandardType>>
               (QuantileState<int,_duckdb::QuantileStandardType> *state,double *target,
               AggregateFinalizeData *finalize_data)

{
  long lVar1;
  AggregateInputData *this;
  FunctionData *pFVar2;
  int *v_t;
  reference pvVar3;
  idx_t iVar4;
  double dVar5;
  undefined1 auVar6 [16];
  Interpolator<false> interp;
  QuantileDirect<int> local_79;
  double local_78;
  double dStack_70;
  Interpolator<false> local_60;
  
  if ((state->v).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (state->v).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar2 = (this->bind_data).ptr;
    pvVar3 = vector<duckdb::QuantileValue,_true>::operator[]
                       ((vector<duckdb::QuantileValue,_true> *)(pFVar2 + 8),0);
    v_t = (state->v).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    iVar4 = (long)(state->v).super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish - (long)v_t >> 2;
    local_60.desc = *(bool *)(pFVar2 + 0x38);
    lVar1 = iVar4 - 1;
    auVar6._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar6._0_8_ = lVar1;
    auVar6._12_4_ = 0x45300000;
    dStack_70 = auVar6._8_8_ - 1.9342813113834067e+25;
    local_78 = (dStack_70 + ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) *
               pvVar3->dbl;
    local_60.RN = local_78;
    dVar5 = floor(local_78);
    local_60.FRN = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
    dVar5 = ceil(local_78);
    local_60.CRN = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
    local_60.begin = 0;
    local_60.end = iVar4;
    dVar5 = Interpolator<false>::Operation<int,double,duckdb::QuantileDirect<int>>
                      (&local_60,v_t,finalize_data->result,&local_79);
    *target = dVar5;
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		Interpolator<DISCRETE> interp(bind_data.quantiles[0], state.v.size(), bind_data.desc);
		target = interp.template Operation<typename STATE::InputType, T>(state.v.data(), finalize_data.result);
	}